

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O3

void BrotliCompressFragmentFastImpl9
               (BrotliOnePassArena *s,uint8_t *input,size_t input_size,int is_last,int *table,
               size_t *storage_ix,uint8_t *storage)

{
  uint32_t *__dest;
  uint32_t *puVar1;
  long *data;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint8_t *puVar6;
  uint16_t *puVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *s1_orig;
  long *begin;
  long *plVar10;
  long *plVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint32_t *puVar14;
  byte bVar15;
  ulong uVar16;
  long *plVar17;
  long lVar18;
  BrotliOnePassArena *array;
  ulong uVar19;
  uint8_t *puVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint8_t *puVar25;
  int iVar26;
  ulong uVar27;
  uint8_t *puVar28;
  uint8_t *puVar29;
  long *plVar30;
  long *plVar31;
  long *plVar32;
  int iVar33;
  size_t storage_ix_start;
  bool bVar34;
  uint8_t *local_110;
  uint8_t *local_108;
  uint8_t *local_d8;
  ulong local_d0;
  
  local_108 = (uint8_t *)0x18000;
  if (input_size < 0x18000) {
    local_108 = (uint8_t *)input_size;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_108,0,storage_ix,storage);
  uVar21 = *storage_ix;
  uVar16 = uVar21 >> 3;
  *(ulong *)(storage + uVar16) = (ulong)storage[uVar16];
  *storage_ix = uVar21 + 0xd;
  local_d0 = BuildAndStoreLiteralPrefixCode
                       (s,input,(size_t)local_108,s->lit_depth,s->lit_bits,storage_ix,storage);
  uVar21 = s->cmd_code_numbits;
  uVar16 = *storage_ix;
  if (7 < uVar21) {
    uVar23 = 0;
    do {
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->cmd_code[uVar23 >> 3] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      uVar16 = uVar16 + 8;
      *storage_ix = uVar16;
      uVar21 = s->cmd_code_numbits;
      uVar19 = uVar23 + 0xf;
      uVar23 = uVar23 + 8;
    } while (uVar19 < uVar21);
  }
  __dest = s->cmd_histo;
  *(ulong *)(storage + (uVar16 >> 3)) =
       (ulong)s->cmd_code[uVar21 >> 3] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
  *storage_ix = ((uint)uVar21 & 7) + uVar16;
  puVar1 = s->cmd_histo + 0x40;
  begin = (long *)input;
  local_110 = (uint8_t *)input_size;
LAB_0111a62e:
  plVar30 = begin;
  plVar32 = begin;
  local_d8 = local_108;
  do {
    switchD_00b041bd::default(__dest,kCmdHistoSeed,0x200);
    data = (long *)((long)plVar30 + (long)local_d8);
    if ((uint8_t *)0xf < local_d8) {
      puVar13 = local_110 + -0x10;
      if (local_d8 + -5 < local_110 + -0x10) {
        puVar13 = local_d8 + -5;
      }
      if (1 < (long)puVar13) {
        plVar17 = (long *)(puVar13 + (long)plVar30);
        plVar11 = (long *)((long)plVar30 + 2);
        iVar24 = -1;
        plVar31 = plVar30;
LAB_0111a6cb:
        lVar18 = *(long *)((long)plVar31 + 1);
        uVar9 = 0x21;
        plVar31 = (long *)((long)plVar31 + 1);
        do {
          plVar10 = plVar11;
          uVar21 = (ulong)(lVar18 * 0x1e35a7bd000000) >> 0x37;
          lVar18 = *plVar10;
          iVar33 = (int)input;
          if ((((int)*plVar31 == *(int *)((long)plVar31 + -(long)iVar24)) &&
              (puVar13 = (uint8_t *)((long)plVar31 + -(long)iVar24),
              *(uint8_t *)((long)plVar31 + 4) == puVar13[4])) && (0 < iVar24)) {
            table[uVar21] = (int)plVar31 - iVar33;
LAB_0111a717:
            if ((long)plVar31 - (long)puVar13 < 0x3fff1) goto LAB_0111a76e;
          }
          else {
            iVar26 = table[uVar21];
            table[uVar21] = (int)plVar31 - iVar33;
            if (((int)*plVar31 == *(int *)(input + iVar26)) &&
               (puVar13 = input + iVar26, *(uint8_t *)((long)plVar31 + 4) == puVar13[4]))
            goto LAB_0111a717;
          }
          plVar11 = (long *)((ulong)(uVar9 >> 5) + (long)plVar10);
          if (plVar17 < plVar11) break;
          uVar9 = uVar9 + 1;
          plVar31 = plVar10;
        } while( true );
      }
    }
LAB_0111b44c:
    local_110 = local_110 + -(long)local_d8;
    local_d8 = (uint8_t *)0x10000;
    if (local_110 < (uint8_t *)0x10000) {
      local_d8 = local_110;
    }
    if (((local_110 == (uint8_t *)0x0) ||
        (local_108 = local_108 + (long)local_d8, "\x7fELF\x02\x01\x01" < local_108)) ||
       (array = s, iVar24 = ShouldMergeBlock(s,(uint8_t *)data,(size_t)local_d8,s->lit_depth),
       iVar24 == 0)) goto LAB_0111b4e7;
    UpdateBits((ulong)((int)local_108 - 1),(int)storage_ix_start + 3,(size_t)storage,
               array->lit_depth);
    plVar30 = data;
  } while( true );
LAB_0111a76e:
  puVar12 = puVar13 + 5;
  lVar18 = (long)plVar31 + 5;
  puVar28 = (uint8_t *)((long)data + (-5 - (long)plVar31));
  puVar20 = puVar12;
  if ((uint8_t *)0x7 < puVar28) {
    lVar22 = 0;
LAB_0111a78a:
    if (*(ulong *)(lVar18 + lVar22) == *(ulong *)(puVar12 + lVar22)) goto code_r0x0111a797;
    uVar16 = *(ulong *)(puVar12 + lVar22) ^ *(ulong *)(lVar18 + lVar22);
    uVar21 = 0;
    if (uVar16 != 0) {
      for (; (uVar16 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
      }
    }
    lVar22 = (uVar21 >> 3 & 0x1fffffff) + lVar22;
    goto LAB_0111a7e9;
  }
LAB_0111a7b1:
  puVar29 = puVar20;
  if (puVar28 != (uint8_t *)0x0) {
    puVar29 = puVar20 + (long)puVar28;
    puVar25 = (uint8_t *)0x0;
    do {
      if (puVar20[(long)puVar25] != puVar25[lVar18]) {
        puVar29 = puVar20 + (long)puVar25;
        break;
      }
      puVar25 = puVar25 + 1;
    } while (puVar28 != puVar25);
  }
  lVar22 = (long)puVar29 - (long)puVar12;
LAB_0111a7e9:
  uVar21 = (long)plVar31 - (long)plVar32;
  if (uVar21 < 0x1842) {
    if (uVar21 < 6) {
      bVar3 = *(byte *)((long)s + uVar21 + 0x328);
      uVar16 = *storage_ix;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)*(ushort *)((long)s + uVar21 * 2 + 0x3d0) << ((byte)uVar16 & 7) |
           (ulong)storage[uVar16 >> 3];
      *storage_ix = bVar3 + uVar16;
      puVar14 = __dest + uVar21 + 0x28;
    }
    else if (uVar21 < 0x82) {
      uVar16 = uVar21 - 2;
      uVar9 = 0x1f;
      if ((uint)uVar16 != 0) {
        for (; (uint)uVar16 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
      uVar19 = uVar16 >> ((byte)uVar9 & 0x3f);
      lVar18 = uVar19 + (ulong)uVar9 * 2;
      uVar23 = *storage_ix;
      uVar27 = *(byte *)((long)s->cmd_bits + lVar18 + -0x56) + uVar23;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)s->cmd_bits[lVar18 + 0x2a] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) =
           uVar16 - (uVar19 << ((byte)uVar9 & 0x3f)) << ((byte)uVar27 & 7) |
           (ulong)storage[uVar27 >> 3];
      *storage_ix = uVar27 + uVar9;
      puVar14 = __dest + lVar18 + 0x2a;
    }
    else if (uVar21 < 0x842) {
      uVar8 = (int)uVar21 - 0x42;
      uVar9 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      lVar18 = -(ulong)(uVar9 ^ 0x1f) + 0x51;
      uVar16 = *storage_ix;
      uVar23 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x351) + uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar18 * 2 + 0x380) << ((byte)uVar16 & 7) |
           (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar23;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (-1L << ((byte)uVar9 & 0x3f)) + uVar21 + -0x42 << ((byte)uVar23 & 7) |
           (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar9 + uVar23;
      puVar14 = __dest + lVar18;
    }
    else {
      bVar3 = s->cmd_depth[0x3d];
      uVar23 = *storage_ix;
      uVar16 = uVar23 + bVar3;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)s->cmd_bits[0x3d] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           uVar21 - 0x842 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = bVar3 + uVar23 + 0xc;
      puVar14 = s->cmd_histo + 0x3d;
    }
  }
  else {
    uVar16 = ((long)plVar32 - (long)begin) * 0x32;
    if ((uVar16 < uVar21 || uVar16 - uVar21 == 0) && (0x3d4 < local_d0)) {
      EmitUncompressedMetaBlock
                ((uint8_t *)begin,(uint8_t *)plVar31,storage_ix_start,storage_ix,storage);
      local_110 = (uint8_t *)((long)plVar30 + ((long)local_110 - (long)plVar31));
      goto LAB_0111b769;
    }
    if (uVar21 < 0x5842) {
      uVar19 = (ulong)s->cmd_depth[0x3e];
      uVar23 = *storage_ix;
      uVar16 = uVar23 + uVar19;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)s->cmd_bits[0x3e] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           uVar21 - 0x1842 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar19 + uVar23 + 0xe;
      puVar14 = s->cmd_histo + 0x3e;
    }
    else {
      uVar19 = (ulong)s->cmd_depth[0x3f];
      uVar23 = *storage_ix;
      uVar16 = uVar23 + uVar19;
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)s->cmd_bits[0x3f] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = uVar16;
      *(ulong *)(storage + (uVar16 >> 3)) =
           uVar21 - 0x5842 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
      *storage_ix = uVar19 + uVar23 + 0x18;
      puVar14 = s->cmd_histo + 0x3f;
    }
  }
  *puVar14 = *puVar14 + 1;
  if (plVar31 != plVar32) {
    uVar16 = *storage_ix;
    lVar18 = 0;
    do {
      bVar3 = s->lit_depth[*(byte *)((long)plVar32 + lVar18)];
      *(ulong *)(storage + (uVar16 >> 3)) =
           (ulong)s->lit_bits[*(byte *)((long)plVar32 + lVar18)] << ((byte)uVar16 & 7) |
           (ulong)storage[uVar16 >> 3];
      uVar16 = uVar16 + bVar3;
      *storage_ix = uVar16;
      lVar18 = lVar18 + 1;
    } while (uVar21 + (uVar21 == 0) != lVar18);
  }
  iVar26 = (int)((long)plVar31 - (long)puVar13);
  if (iVar24 == iVar26) {
    uVar21 = *storage_ix;
    uVar19 = s->cmd_depth[0x40] + uVar21;
    *(ulong *)(storage + (uVar21 >> 3)) =
         (ulong)s->cmd_bits[0x40] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
    puVar14 = puVar1;
    iVar26 = iVar24;
  }
  else {
    uVar21 = (long)iVar26 + 3;
    uVar9 = 0x1f;
    if ((uint)uVar21 != 0) {
      for (; (uint)uVar21 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar8 = 0x1e - (uVar9 ^ 0x1f);
    uVar23 = (ulong)((uVar21 >> ((ulong)uVar8 & 0x3f) & 1) != 0);
    uVar27 = ((uVar9 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar23;
    uVar16 = *storage_ix;
    uVar19 = s->cmd_depth[uVar27 + 0x50] + uVar16;
    *(ulong *)(storage + (uVar16 >> 3)) =
         (ulong)*(ushort *)((long)s->cmd_histo + uVar27 * 2 + -0x60) << ((byte)uVar16 & 7) |
         (ulong)storage[uVar16 >> 3];
    *storage_ix = uVar19;
    *(ulong *)(storage + (uVar19 >> 3)) =
         uVar21 - (uVar23 + 2 << ((byte)uVar8 & 0x3f)) << ((byte)uVar19 & 7) |
         (ulong)storage[uVar19 >> 3];
    uVar19 = uVar19 + uVar8;
    puVar14 = __dest + uVar27 + 0x50;
  }
  *puVar14 = *puVar14 + 1;
  uVar21 = lVar22 + 5;
  *storage_ix = uVar19;
  bVar3 = (byte)uVar19;
  if (uVar21 < 0xc) {
    bVar4 = s->cmd_depth[lVar22 + 1];
    *(ulong *)(storage + (uVar19 >> 3)) =
         (ulong)s->cmd_bits[lVar22 + 1] << (bVar3 & 7) | (ulong)storage[uVar19 >> 3];
    *storage_ix = bVar4 + uVar19;
    puVar14 = __dest + lVar22 + 1;
  }
  else if (uVar21 < 0x48) {
    uVar21 = lVar22 - 3;
    uVar9 = 0x1f;
    if ((uint)uVar21 != 0) {
      for (; (uint)uVar21 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
    uVar16 = uVar21 >> ((byte)uVar9 & 0x3f);
    lVar18 = uVar16 + (ulong)uVar9 * 2;
    bVar4 = *(byte *)((long)s->cmd_bits + lVar18 + -0x7c);
    *(ulong *)(storage + (uVar19 >> 3)) =
         (ulong)s->cmd_bits[lVar18 + 4] << (bVar3 & 7) | (ulong)storage[uVar19 >> 3];
    uVar19 = bVar4 + uVar19;
    *storage_ix = uVar19;
    *(ulong *)(storage + (uVar19 >> 3)) =
         uVar21 - (uVar16 << ((byte)uVar9 & 0x3f)) << ((byte)uVar19 & 7) |
         (ulong)storage[uVar19 >> 3];
    *storage_ix = uVar19 + uVar9;
    puVar14 = __dest + lVar18 + 4;
  }
  else {
    puVar14 = puVar1;
    if (uVar21 < 0x88) {
      uVar16 = lVar22 - 3U >> 5;
      bVar4 = s->cmd_depth[uVar16 + 0x1e];
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)s->cmd_bits[uVar16 + 0x1e] << (bVar3 & 7) | (ulong)storage[uVar19 >> 3];
      uVar21 = uVar19 + bVar4;
      *storage_ix = uVar21;
      *(ulong *)(storage + (uVar21 >> 3)) =
           (ulong)((uint)(lVar22 - 3U) & 0x1f) << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
      uVar23 = uVar19 + bVar4 + 5;
      *storage_ix = uVar23;
      bVar3 = s->cmd_depth[0x40];
      *(ulong *)(storage + (uVar23 >> 3)) =
           (ulong)s->cmd_bits[0x40] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
      *storage_ix = bVar3 + uVar21 + 5;
      s->cmd_histo[uVar16 + 0x1e] = s->cmd_histo[uVar16 + 0x1e] + 1;
    }
    else if (uVar21 < 0x848) {
      uVar8 = (int)lVar22 - 0x43;
      uVar9 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      lVar18 = -(ulong)(uVar9 ^ 0x1f) + 0x3b;
      bVar4 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x33b);
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)*(ushort *)((long)s + lVar18 * 2 + 0x380) << (bVar3 & 7) |
           (ulong)storage[uVar19 >> 3];
      uVar19 = bVar4 + uVar19;
      *storage_ix = uVar19;
      uVar21 = uVar9 + uVar19;
      *(ulong *)(storage + (uVar19 >> 3)) =
           (-1L << ((byte)uVar9 & 0x3f)) + lVar22 + -0x43 << ((byte)uVar19 & 7) |
           (ulong)storage[uVar19 >> 3];
      *storage_ix = uVar21;
      bVar3 = s->cmd_depth[0x40];
      *(ulong *)(storage + (uVar21 >> 3)) =
           (ulong)s->cmd_bits[0x40] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
      *storage_ix = bVar3 + uVar21;
      piVar2 = (int *)((long)s + lVar18 * 4 + 0x480);
      *piVar2 = *piVar2 + 1;
    }
    else {
      bVar4 = s->cmd_depth[0x27];
      *(ulong *)(storage + (uVar19 >> 3)) =
           (ulong)s->cmd_bits[0x27] << (bVar3 & 7) | (ulong)storage[uVar19 >> 3];
      uVar21 = uVar19 + bVar4;
      *storage_ix = uVar21;
      bVar15 = (byte)uVar21 & 7;
      *(ulong *)(storage + (uVar21 >> 3)) = lVar22 + -0x843 << bVar15 | (ulong)storage[uVar21 >> 3];
      uVar16 = bVar4 + uVar19 + 0x18;
      *storage_ix = uVar16;
      bVar3 = s->cmd_depth[0x40];
      uVar16 = uVar16 >> 3;
      *(ulong *)(storage + uVar16) = (ulong)s->cmd_bits[0x40] << bVar15 | (ulong)storage[uVar16];
      *storage_ix = bVar3 + uVar21 + 0x18;
      s->cmd_histo[0x27] = s->cmd_histo[0x27] + 1;
    }
  }
  plVar32 = (long *)((long)plVar31 + lVar22 + 5);
  *puVar14 = *puVar14 + 1;
  if (plVar17 <= plVar32) goto LAB_0111b44c;
  uVar21 = *(ulong *)((long)plVar31 + lVar22 + 2);
  uVar16 = (uVar21 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
  iVar24 = (int)plVar32 - iVar33;
  table[uVar21 * 0x1e35a7bd000000 >> 0x37] = iVar24 + -3;
  table[(uVar21 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar24 + -2;
  table[(uVar21 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar24 + -1;
  iVar5 = table[uVar16];
  table[uVar16] = iVar24;
  iVar24 = iVar26;
  if (((int)*plVar32 == *(int *)(input + iVar5)) &&
     (puVar13 = input + iVar5, plVar11 = plVar32,
     *(uint8_t *)((long)plVar31 + lVar22 + 9) == puVar13[4])) {
LAB_0111af33:
    puVar20 = puVar13 + 5;
    puVar12 = (uint8_t *)((long)plVar11 + 5);
    puVar29 = (uint8_t *)((long)data + (-5 - (long)plVar11));
    puVar28 = puVar20;
    if ((uint8_t *)0x7 < puVar29) {
      lVar18 = 0;
LAB_0111af4f:
      if (*(ulong *)(puVar12 + lVar18) == *(ulong *)(puVar20 + lVar18)) goto code_r0x0111af5c;
      uVar16 = *(ulong *)(puVar20 + lVar18) ^ *(ulong *)(puVar12 + lVar18);
      uVar21 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      lVar18 = (uVar21 >> 3 & 0x1fffffff) + lVar18;
      goto LAB_0111afb9;
    }
    goto LAB_0111af76;
  }
LAB_0111b30f:
  plVar11 = (long *)((long)plVar32 + 2);
  plVar31 = plVar32;
  if (plVar17 < plVar11) goto LAB_0111b44c;
  goto LAB_0111a6cb;
code_r0x0111a797:
  puVar28 = puVar28 + -8;
  lVar22 = lVar22 + 8;
  if (puVar28 < (uint8_t *)0x8) goto code_r0x0111a7a5;
  goto LAB_0111a78a;
code_r0x0111a7a5:
  lVar18 = lVar18 + lVar22;
  puVar20 = puVar12 + lVar22;
  goto LAB_0111a7b1;
code_r0x0111af5c:
  puVar29 = puVar29 + -8;
  lVar18 = lVar18 + 8;
  if (puVar29 < (uint8_t *)0x8) goto code_r0x0111af6a;
  goto LAB_0111af4f;
code_r0x0111af6a:
  puVar12 = puVar12 + lVar18;
  puVar28 = puVar20 + lVar18;
LAB_0111af76:
  if (puVar29 != (uint8_t *)0x0) {
    puVar25 = (uint8_t *)0x0;
    do {
      puVar6 = puVar25;
      if (puVar28[(long)puVar25] != puVar12[(long)puVar25]) break;
      puVar25 = puVar25 + 1;
      puVar6 = puVar29;
    } while (puVar29 != puVar25);
    puVar28 = puVar28 + (long)puVar6;
  }
  lVar18 = (long)puVar28 - (long)puVar20;
LAB_0111afb9:
  plVar32 = plVar11;
  iVar24 = iVar26;
  if (0x3fff0 < (long)plVar11 - (long)puVar13) goto LAB_0111b30f;
  uVar21 = lVar18 + 5;
  if (uVar21 < 10) {
    bVar3 = s->cmd_depth[lVar18 + 0x13];
    uVar21 = *storage_ix;
    *(ulong *)(storage + (uVar21 >> 3)) =
         (ulong)s->cmd_bits[lVar18 + 0x13] << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
    *storage_ix = bVar3 + uVar21;
    puVar14 = __dest + lVar18 + 0x13;
  }
  else if (uVar21 < 0x86) {
    uVar21 = lVar18 - 1;
    uVar9 = 0x1f;
    if ((uint)uVar21 != 0) {
      for (; (uint)uVar21 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
    uVar19 = uVar21 >> ((byte)uVar9 & 0x3f);
    lVar22 = uVar19 + (ulong)uVar9 * 2;
    uVar16 = *storage_ix;
    uVar23 = *(byte *)((long)s->cmd_bits + lVar22 + -0x6c) + uVar16;
    *(ulong *)(storage + (uVar16 >> 3)) =
         (ulong)s->cmd_bits[lVar22 + 0x14] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
    *storage_ix = uVar23;
    *(ulong *)(storage + (uVar23 >> 3)) =
         uVar21 - (uVar19 << ((byte)uVar9 & 0x3f)) << ((byte)uVar23 & 7) |
         (ulong)storage[uVar23 >> 3];
    *storage_ix = uVar23 + uVar9;
    puVar14 = __dest + lVar22 + 0x14;
  }
  else if (uVar21 < 0x846) {
    uVar8 = (int)lVar18 - 0x41;
    uVar9 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    lVar22 = -(ulong)(uVar9 ^ 0x1f) + 0x3b;
    uVar21 = *storage_ix;
    uVar16 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x33b) + uVar21;
    *(ulong *)(storage + (uVar21 >> 3)) =
         (ulong)*(ushort *)((long)s + lVar22 * 2 + 0x380) << ((byte)uVar21 & 7) |
         (ulong)storage[uVar21 >> 3];
    *storage_ix = uVar16;
    *(ulong *)(storage + (uVar16 >> 3)) =
         (-1L << ((byte)uVar9 & 0x3f)) + lVar18 + -0x41 << ((byte)uVar16 & 7) |
         (ulong)storage[uVar16 >> 3];
    *storage_ix = uVar9 + uVar16;
    puVar14 = __dest + lVar22;
  }
  else {
    bVar3 = s->cmd_depth[0x27];
    uVar16 = *storage_ix;
    uVar21 = uVar16 + bVar3;
    *(ulong *)(storage + (uVar16 >> 3)) =
         (ulong)s->cmd_bits[0x27] << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
    *storage_ix = uVar21;
    *(ulong *)(storage + (uVar21 >> 3)) =
         lVar18 + -0x841 << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
    *storage_ix = bVar3 + uVar16 + 0x18;
    puVar14 = s->cmd_histo + 0x27;
  }
  *puVar14 = *puVar14 + 1;
  iVar26 = (int)((long)plVar11 - (long)puVar13);
  uVar21 = (long)iVar26 + 3;
  uVar9 = 0x1f;
  if ((uint)uVar21 != 0) {
    for (; (uint)uVar21 >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar8 = 0x1e - (uVar9 ^ 0x1f);
  uVar19 = (ulong)((uVar21 >> ((ulong)uVar8 & 0x3f) & 1) != 0);
  uVar23 = ((uVar9 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar19;
  uVar16 = *storage_ix;
  bVar3 = s->cmd_depth[uVar23 + 0x50];
  *(ulong *)(storage + (uVar16 >> 3)) =
       (ulong)*(ushort *)((long)s->cmd_histo + uVar23 * 2 + -0x60) << ((byte)uVar16 & 7) |
       (ulong)storage[uVar16 >> 3];
  uVar16 = bVar3 + uVar16;
  *storage_ix = uVar16;
  *(ulong *)(storage + (uVar16 >> 3)) =
       uVar21 - (uVar19 + 2 << ((byte)uVar8 & 0x3f)) << ((byte)uVar16 & 7) |
       (ulong)storage[uVar16 >> 3];
  plVar32 = (long *)((long)plVar11 + lVar18 + 5);
  *storage_ix = uVar16 + uVar8;
  s->cmd_histo[uVar23 + 0x50] = s->cmd_histo[uVar23 + 0x50] + 1;
  if (plVar17 <= plVar32) goto LAB_0111b44c;
  uVar21 = *(ulong *)((long)plVar11 + lVar18 + 2);
  uVar16 = (uVar21 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
  iVar24 = (int)plVar32 - iVar33;
  table[uVar21 * 0x1e35a7bd000000 >> 0x37] = iVar24 + -3;
  table[(uVar21 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar24 + -2;
  table[(uVar21 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar24 + -1;
  iVar5 = table[uVar16];
  table[uVar16] = iVar24;
  iVar24 = iVar26;
  if (((int)*plVar32 != *(int *)(input + iVar5)) ||
     (puVar13 = input + iVar5, puVar20 = (uint8_t *)((long)plVar11 + lVar18 + 9), plVar11 = plVar32,
     *puVar20 != puVar13[4])) goto LAB_0111b30f;
  goto LAB_0111af33;
LAB_0111b4e7:
  plVar31 = data;
  if (plVar32 < data) {
    uVar21 = (long)data - (long)plVar32;
    if (uVar21 < 0x1842) {
      if (uVar21 < 6) {
        bVar3 = *(byte *)((long)s + uVar21 + 0x328);
        uVar16 = *storage_ix;
        *(ulong *)(storage + (uVar16 >> 3)) =
             (ulong)*(ushort *)((long)s + uVar21 * 2 + 0x3d0) << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        *storage_ix = bVar3 + uVar16;
        puVar14 = __dest + uVar21 + 0x28;
      }
      else if (uVar21 < 0x82) {
        uVar16 = uVar21 - 2;
        uVar9 = 0x1f;
        if ((uint)uVar16 != 0) {
          for (; (uint)uVar16 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uVar9 ^ 0xffffffe0) + 0x1f;
        uVar27 = uVar16 >> ((byte)uVar9 & 0x3f);
        lVar18 = uVar27 + (ulong)uVar9 * 2;
        uVar23 = *storage_ix;
        uVar19 = *(byte *)((long)s->cmd_bits + lVar18 + -0x56) + uVar23;
        *(ulong *)(storage + (uVar23 >> 3)) =
             (ulong)s->cmd_bits[lVar18 + 0x2a] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
        *storage_ix = uVar19;
        *(ulong *)(storage + (uVar19 >> 3)) =
             uVar16 - (uVar27 << ((byte)uVar9 & 0x3f)) << ((byte)uVar19 & 7) |
             (ulong)storage[uVar19 >> 3];
        *storage_ix = uVar19 + uVar9;
        puVar14 = __dest + lVar18 + 0x2a;
      }
      else if (uVar21 < 0x842) {
        uVar8 = (int)uVar21 - 0x42;
        uVar9 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        lVar18 = -(ulong)(uVar9 ^ 0x1f) + 0x51;
        uVar16 = *storage_ix;
        uVar23 = *(byte *)((long)s + -(ulong)(uVar9 ^ 0x1f) + 0x351) + uVar16;
        *(ulong *)(storage + (uVar16 >> 3)) =
             (ulong)*(ushort *)((long)s + lVar18 * 2 + 0x380) << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        *storage_ix = uVar23;
        *(ulong *)(storage + (uVar23 >> 3)) =
             (-1L << ((byte)uVar9 & 0x3f)) + uVar21 + -0x42 << ((byte)uVar23 & 7) |
             (ulong)storage[uVar23 >> 3];
        *storage_ix = uVar9 + uVar23;
        puVar14 = __dest + lVar18;
      }
      else {
        bVar3 = s->cmd_depth[0x3d];
        uVar23 = *storage_ix;
        uVar16 = uVar23 + bVar3;
        *(ulong *)(storage + (uVar23 >> 3)) =
             (ulong)s->cmd_bits[0x3d] << ((byte)uVar23 & 7) | (ulong)storage[uVar23 >> 3];
        *storage_ix = uVar16;
        *(ulong *)(storage + (uVar16 >> 3)) =
             uVar21 - 0x842 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
        *storage_ix = bVar3 + uVar23 + 0xc;
        puVar14 = s->cmd_histo + 0x3d;
      }
      *puVar14 = *puVar14 + 1;
      uVar16 = *storage_ix;
      lVar18 = 0;
      do {
        bVar3 = s->lit_depth[*(byte *)((long)plVar32 + lVar18)];
        *(ulong *)(storage + (uVar16 >> 3)) =
             (ulong)s->lit_bits[*(byte *)((long)plVar32 + lVar18)] << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        uVar16 = uVar16 + bVar3;
        *storage_ix = uVar16;
        lVar18 = lVar18 + 1;
      } while (uVar21 + (uVar21 == 0) != lVar18);
    }
    else {
      uVar16 = ((long)plVar32 - (long)begin) * 0x32;
      if ((uVar16 < uVar21 || uVar16 - uVar21 == 0) && (0x3d4 < local_d0)) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)begin,(uint8_t *)data,storage_ix_start,storage_ix,storage);
      }
      else {
        bVar34 = uVar21 < 0x5842;
        puVar14 = s->cmd_histo + 0x3f;
        puVar7 = s->cmd_bits + 0x3f;
        puVar13 = s->cmd_depth + 0x3f;
        if (bVar34) {
          puVar14 = s->cmd_histo + 0x3e;
          puVar7 = s->cmd_bits + 0x3e;
          puVar13 = s->cmd_depth + 0x3e;
        }
        bVar3 = *puVar13;
        uVar16 = *storage_ix;
        lVar18 = uVar16 + 0x18;
        if (bVar34) {
          lVar18 = uVar16 + 0xe;
        }
        uVar23 = lVar18 + (ulong)bVar3;
        *(ulong *)(storage + (uVar16 >> 3)) =
             (ulong)*puVar7 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
        uVar16 = uVar16 + bVar3;
        *storage_ix = uVar16;
        *(ulong *)(storage + (uVar16 >> 3)) =
             ((ulong)bVar34 << 0xe | 0xffffffffffffa7be) + uVar21 << ((byte)uVar16 & 7) |
             (ulong)storage[uVar16 >> 3];
        *puVar14 = *puVar14 + 1;
        *storage_ix = uVar23;
        uVar16 = 0;
        do {
          bVar3 = s->lit_depth[*(byte *)((long)plVar32 + uVar16)];
          *(ulong *)(storage + (uVar23 >> 3)) =
               (ulong)s->lit_bits[*(byte *)((long)plVar32 + uVar16)] << ((byte)uVar23 & 7) |
               (ulong)storage[uVar23 >> 3];
          uVar23 = uVar23 + bVar3;
          *storage_ix = uVar23;
          uVar16 = uVar16 + 1;
        } while (uVar21 != uVar16);
      }
    }
  }
LAB_0111b769:
  begin = plVar31;
  if (local_110 == (uint8_t *)0x0) {
    if (is_last != 0) {
      return;
    }
    s->cmd_code[0] = '\0';
    s->cmd_code_numbits = 0;
    BuildAndStoreCommandPrefixCode(s,&s->cmd_code_numbits,s->cmd_code);
    return;
  }
  local_108 = (uint8_t *)0x18000;
  if (local_110 < (uint8_t *)0x18000) {
    local_108 = local_110;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_108,0,storage_ix,storage);
  uVar21 = *storage_ix;
  uVar16 = uVar21 >> 3;
  *(ulong *)(storage + uVar16) = (ulong)storage[uVar16];
  *storage_ix = uVar21 + 0xd;
  local_d0 = BuildAndStoreLiteralPrefixCode
                       (s,(uint8_t *)begin,(size_t)local_108,s->lit_depth,s->lit_bits,storage_ix,
                        storage);
  BuildAndStoreCommandPrefixCode(s,storage_ix,storage);
  goto LAB_0111a62e;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentFast(
    BrotliOnePassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          s, input, input_size, is_last, table, storage_ix, storage);\
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}